

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_data_cleanup(int delete_file)

{
  int iVar1;
  void *uuid_00;
  intptr_t uuid;
  int delete_file_local;
  
  if ((delete_file != 0) && (cluster_data.name[0] != '\0')) {
    unlink(cluster_data.name);
  }
  while (iVar1 = fio_ls_any(&cluster_data.clients), iVar1 != 0) {
    uuid_00 = fio_ls_pop(&cluster_data.clients);
    if (0 < (long)uuid_00) {
      fio_close((intptr_t)uuid_00);
    }
  }
  cluster_data.uuid = 0;
  cluster_data.lock = '\0';
  cluster_data.clients.prev = &cluster_data.clients;
  cluster_data.clients.next = &cluster_data.clients;
  cluster_data.clients.obj = (void *)0x0;
  return;
}

Assistant:

static void fio_cluster_data_cleanup(int delete_file) {
  if (delete_file && cluster_data.name[0]) {
#if DEBUG
    FIO_LOG_DEBUG("(%d) unlinking cluster's Unix socket.", (int)getpid());
#endif
    unlink(cluster_data.name);
  }
  while (fio_ls_any(&cluster_data.clients)) {
    intptr_t uuid = (intptr_t)fio_ls_pop(&cluster_data.clients);
    if (uuid > 0) {
      fio_close(uuid);
    }
  }
  cluster_data.uuid = 0;
  cluster_data.lock = FIO_LOCK_INIT;
  cluster_data.clients = (fio_ls_s)FIO_LS_INIT(cluster_data.clients);
}